

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::CMP_OP(SQVM *this,CmpOP op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *res)

{
  bool bVar1;
  long in_RAX;
  SQInteger r;
  long local_18;
  
  local_18 = in_RAX;
  bVar1 = ObjCmp(this,o1,o2,&local_18);
  if (!bVar1) {
    return false;
  }
  bVar1 = false;
  switch(op) {
  case CMP_G:
    bVar1 = 0 < local_18;
    break;
  default:
    goto switchD_0011dd2e_caseD_1;
  case CMP_GE:
    bVar1 = -1 < local_18;
    break;
  case CMP_L:
    bVar1 = SUB81((ulong)local_18 >> 0x3f,0);
    break;
  case CMP_LE:
    bVar1 = local_18 < 1;
    break;
  case CMP_3W:
    SQObjectPtr::operator=(res,local_18);
    goto LAB_0011dd6e;
  }
  SQObjectPtr::operator=(res,bVar1);
LAB_0011dd6e:
  bVar1 = true;
switchD_0011dd2e_caseD_1:
  return bVar1;
}

Assistant:

bool SQVM::CMP_OP(CmpOP op, const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &res)
{
    SQInteger r;
    if(ObjCmp(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}